

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O1

int BIO_read_asn1(BIO *bio,uint8_t **out,size_t *out_len,size_t max_len)

{
  bool bVar1;
  uint8_t **ppuVar2;
  int iVar3;
  uint uVar4;
  ushort *puVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  byte *data;
  size_t size;
  int line;
  char cVar9;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  uint8_t header [6];
  int eof_on_first_read;
  undefined2 local_56;
  byte local_54 [4];
  uint8_t **local_50;
  size_t *local_48;
  int local_3c;
  size_t local_38;
  
  iVar3 = bio_read_full(bio,(uint8_t *)&local_56,&local_3c,2);
  if (iVar3 == 0) {
    if (local_3c == 0) {
      iVar3 = 0xa2;
      line = 0x1df;
    }
    else {
      iVar3 = 0x7b;
      line = 0x1dd;
    }
    goto LAB_00528d32;
  }
  if ((~(byte)local_56 & 0x1f) == 0) {
    iVar3 = 0x6d;
    line = 0x1e9;
    goto LAB_00528d32;
  }
  local_38 = max_len;
  uVar11 = (ulong)local_56._1_1_;
  if ((short)local_56 < 0) {
    sVar10 = (size_t)(local_56._1_1_ & 0x7f);
    cVar9 = (char)(local_56._1_1_ & 0x7f);
    if (((local_56 & 0x20) == 0) || (cVar9 != '\0')) {
      if ((byte)(cVar9 - 5U) < 0xfc) {
        ERR_put_error(0xc,0,0x6d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                      ,0x200);
      }
      else {
        local_48 = out_len;
        local_50 = out;
        data = local_54;
        uVar7 = sVar10;
        do {
          uVar8 = uVar7;
          if (uVar8 == 0) goto LAB_00528c4b;
          iVar3 = 0x7fffffff;
          if (uVar8 < 0x80000000) {
            iVar3 = (int)uVar8;
          }
          uVar4 = BIO_read((BIO *)bio,data,iVar3);
          uVar7 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar7 = 0;
          }
          data = data + uVar7;
          uVar7 = uVar8 - uVar7;
        } while (0 < (int)uVar4);
        if (uVar8 != 0) {
          ERR_put_error(0xc,0,0xa2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                        ,0x205);
          iVar3 = 0;
          out = local_50;
          goto LAB_00528c94;
        }
LAB_00528c4b:
        out_len = local_48;
        out = local_50;
        if (cVar9 == '\0') {
          uVar4 = 0;
        }
        else {
          uVar7 = 0;
          uVar4 = 0;
          do {
            uVar4 = (uint)local_54[uVar7] | uVar4 << 8;
            uVar7 = uVar7 + 1;
          } while (sVar10 != uVar7);
        }
        sVar10 = sVar10 + 2;
        if (uVar4 < 0x80) {
          iVar3 = 0x212;
        }
        else {
          if (uVar4 >> (local_56._1_1_ * '\b' - 8 & 0x1f) != 0) {
            uVar11 = (ulong)uVar4;
            iVar3 = 0;
            bVar1 = true;
            goto LAB_00528d0b;
          }
          iVar3 = 0x218;
        }
        ERR_put_error(0xc,0,0x6d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                      ,iVar3);
      }
      bVar1 = false;
      iVar3 = 0;
    }
    else {
      uVar7 = 0x1002;
      if (max_len < 0x1002) {
        uVar7 = max_len;
      }
      local_48 = out_len;
      sVar10 = max_len;
      if (1 < max_len) {
        puVar5 = (ushort *)OPENSSL_malloc(uVar7);
        *out = (uint8_t *)puVar5;
        if (puVar5 != (ushort *)0x0) {
          *puVar5 = local_56;
          uVar11 = 2;
          do {
            uVar8 = uVar7 - uVar11;
            if (uVar8 == 0) {
              OPENSSL_free(*out);
              goto LAB_00528c72;
            }
            if (0x7ffffffe < uVar8) {
              uVar8 = 0x7fffffff;
            }
            iVar3 = BIO_read((BIO *)bio,*out + uVar11,(int)uVar8);
            if (iVar3 == -1) {
LAB_00528b70:
              OPENSSL_free(*out);
              bVar1 = false;
              local_50 = (uint8_t **)((ulong)local_50 & 0xffffffff00000000);
            }
            else if (iVar3 == 0) {
              *local_48 = uVar11;
              local_50 = (uint8_t **)CONCAT44(local_50._4_4_,1);
              bVar1 = false;
            }
            else {
              uVar11 = uVar11 + (long)iVar3;
              bVar1 = true;
              if ((uVar7 < max_len) && (uVar7 - uVar11 < 0x800)) {
                uVar8 = uVar7 + 0x1000;
                if (max_len <= uVar7 + 0x1000) {
                  uVar8 = max_len;
                }
                bVar12 = 0xffffffffffffefff < uVar7;
                uVar7 = uVar8;
                if (bVar12) {
                  uVar7 = max_len;
                }
                puVar6 = (uint8_t *)OPENSSL_realloc(*out,uVar7);
                if (puVar6 == (uint8_t *)0x0) goto LAB_00528b70;
                *out = puVar6;
              }
            }
          } while (bVar1);
          if ((int)local_50 != 0) {
            iVar3 = 1;
            goto LAB_00528c94;
          }
        }
      }
LAB_00528c72:
      ERR_put_error(0xc,0,0xa2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                    ,0x1f9);
      iVar3 = 0;
LAB_00528c94:
      bVar1 = false;
      out_len = local_48;
    }
LAB_00528d0b:
    if (!bVar1) {
      return iVar3;
    }
  }
  else {
    sVar10 = 2;
  }
  size = sVar10 + uVar11;
  if (((!CARRY8(sVar10,uVar11)) && (uVar11 < 0x80000000)) && (size <= local_38)) {
    *out_len = size;
    puVar6 = (uint8_t *)OPENSSL_malloc(size);
    *out = puVar6;
    if (puVar6 == (uint8_t *)0x0) {
      return 0;
    }
    memcpy(puVar6,&local_56,sVar10);
    puVar6 = *out + sVar10;
    local_50 = out;
    do {
      uVar7 = uVar11;
      if (uVar7 == 0) {
        return 1;
      }
      iVar3 = 0x7fffffff;
      if (uVar7 < 0x80000000) {
        iVar3 = (int)uVar7;
      }
      uVar4 = BIO_read((BIO *)bio,puVar6,iVar3);
      ppuVar2 = local_50;
      uVar11 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar11 = 0;
      }
      puVar6 = puVar6 + uVar11;
      uVar11 = uVar7 - uVar11;
    } while (0 < (int)uVar4);
    if (uVar7 == 0) {
      return 1;
    }
    ERR_put_error(0xc,0,0xa2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x22c);
    OPENSSL_free(*ppuVar2);
    return 0;
  }
  iVar3 = 0xb1;
  line = 0x220;
LAB_00528d32:
  ERR_put_error(0xc,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,line);
  return 0;
}

Assistant:

int BIO_read_asn1(BIO *bio, uint8_t **out, size_t *out_len, size_t max_len) {
  uint8_t header[6];

  static const size_t kInitialHeaderLen = 2;
  int eof_on_first_read;
  if (!bio_read_full(bio, header, &eof_on_first_read, kInitialHeaderLen)) {
    if (eof_on_first_read) {
      // Historically, OpenSSL returned |ASN1_R_HEADER_TOO_LONG| when
      // |d2i_*_bio| could not read anything. CPython conditions on this to
      // determine if |bio| was empty.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    } else {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    }
    return 0;
  }

  const uint8_t tag = header[0];
  const uint8_t length_byte = header[1];

  if ((tag & 0x1f) == 0x1f) {
    // Long form tags are not supported.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return 0;
  }

  size_t len, header_len;
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = length_byte;
    header_len = kInitialHeaderLen;
  } else {
    const size_t num_bytes = length_byte & 0x7f;

    if ((tag & 0x20 /* constructed */) != 0 && num_bytes == 0) {
      // indefinite length.
      if (!bio_read_all(bio, out, out_len, header, kInitialHeaderLen,
                        max_len)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
        return 0;
      }
      return 1;
    }

    if (num_bytes == 0 || num_bytes > 4) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if (!bio_read_full(bio, header + kInitialHeaderLen, NULL, num_bytes)) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
      return 0;
    }
    header_len = kInitialHeaderLen + num_bytes;

    uint32_t len32 = 0;
    for (unsigned i = 0; i < num_bytes; i++) {
      len32 <<= 8;
      len32 |= header[kInitialHeaderLen + i];
    }

    if (len32 < 128) {
      // Length should have used short-form encoding.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if ((len32 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    len = len32;
  }

  if (len + header_len < len || len + header_len > max_len || len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return 0;
  }
  len += header_len;
  *out_len = len;

  *out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (*out == NULL) {
    return 0;
  }
  OPENSSL_memcpy(*out, header, header_len);
  if (!bio_read_full(bio, (*out) + header_len, NULL, len - header_len)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    OPENSSL_free(*out);
    return 0;
  }

  return 1;
}